

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::~ClaspFacade(ClaspFacade *this)

{
  ModelHandler *in_RDI;
  
  in_RDI->_vptr_ModelHandler = (_func_int **)&PTR__ClaspFacade_002dc0d8;
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x1241fd);
  SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::ClaspFacade::Statistics,_Clasp::DeleteObject> *)0x12420e);
  SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)0x12421f);
  SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::ProgramBuilder,_Clasp::DeleteObject> *)0x124230);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x124241);
  SharedContext::~SharedContext((SharedContext *)this);
  ModelHandler::~ModelHandler(in_RDI);
  return;
}

Assistant:

ClaspFacade::~ClaspFacade() {}